

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O0

pair<double,_double> __thiscall
manager::Manager<ttt::Board>::Match
          (Manager<ttt::Board> *this,longlong bot_id1,longlong bot_id2,int count)

{
  undefined8 *puVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_ECX;
  long *in_RDI;
  pair<double,_double> pVar4;
  pair<double,_double> new_ratings;
  IMove move;
  int status;
  IBot<ttt::Board> *bs [2];
  Board *game_copy;
  int i;
  iterator it2;
  iterator it1;
  pair<double,_double> results;
  unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
  *in_stack_ffffffffffffff28;
  IMove *in_stack_ffffffffffffff38;
  Board *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  undefined8 *in_stack_ffffffffffffff50;
  long *in_stack_ffffffffffffff58;
  MM *in_stack_ffffffffffffff60;
  double local_88;
  double local_80;
  int local_6c;
  MM *local_68;
  long *local_60;
  undefined8 *local_50;
  int local_44;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_40;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_38;
  int local_2c;
  pair<double,_double> local_10;
  
  local_2c = in_ECX;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x2310a4);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_manager::Bot<ttt::Board>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x2310c2);
  std::pair<double,_double>::pair<double,_double,_true>(&local_10);
  local_44 = 0;
  do {
    if (local_2c <= local_44) {
      local_10.first = local_10.first / (double)local_2c;
      local_10.second = local_10.second / (double)local_2c;
      std::__detail::
      _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                  *)0x231411);
      std::__detail::
      _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                  *)0x231431);
      pVar4 = MM::operator()(in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58,
                             (double)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_88 = pVar4.first;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                             *)0x231474);
      ppVar3->second->rating = local_88;
      local_80 = pVar4.second;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                             *)0x231499);
      ppVar3->second->rating = local_80;
      pVar4.second = local_10.second;
      pVar4.first = local_10.first;
      return pVar4;
    }
    local_50 = (undefined8 *)operator_new(10);
    puVar1 = (undefined8 *)*in_RDI;
    *local_50 = *puVar1;
    *(undefined2 *)(local_50 + 1) = *(undefined2 *)(puVar1 + 1);
    memset(&local_68,0,0x10);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                         *)0x23113c);
    iVar2 = (*ppVar3->second->bot->_vptr_IBot[2])();
    (&local_68)[local_44 % 2] = (MM *)CONCAT44(extraout_var,iVar2);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false,_false>
                         *)0x231171);
    iVar2 = (*ppVar3->second->bot->_vptr_IBot[2])();
    (&local_68)[1 - local_44 % 2] = (MM *)CONCAT44(extraout_var_00,iVar2);
    local_6c = ttt::Board::GetStatus((Board *)0x2311ac);
    while (local_6c == -1) {
      (**(code **)(*(long *)local_68 + 0x18))();
      ttt::Board::ApplyMove(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      (**(code **)(*local_60 + 0x20))();
      local_6c = ttt::Board::GetStatus((Board *)0x2311fa);
      if (local_6c != -1) break;
      (**(code **)(*local_60 + 0x18))();
      ttt::Board::ApplyMove(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      (**(code **)(*(long *)local_68 + 0x20))();
      local_6c = ttt::Board::GetStatus((Board *)0x231246);
    }
    if (local_6c == 0) {
      local_10.first = local_10.first + 0.5;
      local_10.second = local_10.second + 0.5;
    }
    else if (local_6c == 1) {
      if (local_44 % 2 == 0) {
        local_10.first = local_10.first + 1.0;
      }
      else {
        local_10.second = local_10.second + 1.0;
      }
    }
    else if (local_44 % 2 == 0) {
      local_10.second = local_10.second + 1.0;
    }
    else {
      local_10.first = local_10.first + 1.0;
    }
    in_stack_ffffffffffffff60 = local_68;
    if (local_68 != (MM *)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
    in_stack_ffffffffffffff58 = local_60;
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    in_stack_ffffffffffffff50 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      operator_delete(local_50);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}